

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jctrans.c
# Opt level: O0

void jpeg_write_coefficients(j_compress_ptr cinfo,jvirt_barray_ptr *coef_arrays)

{
  j_compress_ptr in_RSI;
  j_compress_ptr in_RDI;
  jvirt_barray_ptr *in_stack_ffffffffffffffe8;
  
  if (in_RDI->global_state != 100) {
    in_RDI->err->msg_code = 0x14;
    (in_RDI->err->msg_parm).i[0] = in_RDI->global_state;
    (*in_RDI->err->error_exit)((j_common_ptr)in_RDI);
  }
  jpeg_suppress_tables(in_RDI,0);
  (*in_RDI->err->reset_error_mgr)((j_common_ptr)in_RDI);
  (*in_RDI->dest->init_destination)(in_RDI);
  transencode_master_selection(in_RSI,in_stack_ffffffffffffffe8);
  in_RDI->next_scanline = 0;
  in_RDI->global_state = 0x67;
  return;
}

Assistant:

GLOBAL(void)
jpeg_write_coefficients(j_compress_ptr cinfo, jvirt_barray_ptr *coef_arrays)
{
  if (cinfo->global_state != CSTATE_START)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  /* Mark all tables to be written */
  jpeg_suppress_tables(cinfo, FALSE);
  /* (Re)initialize error mgr and destination modules */
  (*cinfo->err->reset_error_mgr) ((j_common_ptr)cinfo);
  (*cinfo->dest->init_destination) (cinfo);
  /* Perform master selection of active modules */
  transencode_master_selection(cinfo, coef_arrays);
  /* Wait for jpeg_finish_compress() call */
  cinfo->next_scanline = 0;     /* so jpeg_write_marker works */
  cinfo->global_state = CSTATE_WRCOEFS;
}